

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O1

int hasLib(char *name)

{
  Library *pLVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  pLVar1 = libraries;
  lVar4 = (long)libCount;
  if (0 < lVar4) {
    lVar3 = 0;
    do {
      iVar2 = strcmp(*(char **)((long)&pLVar1->name + lVar3),name);
      if (iVar2 == 0) {
        return 1;
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar4 * 0x10 != lVar3);
  }
  return 0;
}

Assistant:

static int hasLib(char *name){
    int i = 0;
    while(i < libCount){
        if(strcmp(libraries[i].name, name) == 0)
            return 1;
        i++;
    }
    return 0;
}